

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

uint ParseScriptFlags(string strFlags)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type_conflict *pmVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator in_R8;
  iterator in_R9;
  pointer __x;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  string_view str;
  check_type cVar6;
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined ***local_b8;
  key_type *local_b0;
  lazy_ostream local_a8;
  undefined ***local_98;
  char *local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  if (in_RDI->_M_string_length != 0) {
    bVar2 = std::operator==(in_RDI,"NONE");
    uVar5 = 0;
    if (!bVar2) {
      str._M_str = (char *)0x2c;
      str._M_len = (size_t)(in_RDI->_M_dataplus)._M_p;
      util::SplitString_abi_cxx11_(&words,(util *)in_RDI->_M_string_length,str,(char)in_R8);
      uVar5 = 0;
      for (__x = words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          __x != words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::count(&mapFlagNames_abi_cxx11_,__x);
        if (sVar3 == 0) {
          local_60 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_58 = "";
          local_70 = &boost::unit_test::basic_cstring<char_const>::null;
          local_68 = &boost::unit_test::basic_cstring<char_const>::null;
          msg.m_end = in_R9;
          msg.m_begin = in_R8;
          file.m_end = (iterator)0x54;
          file.m_begin = (iterator)&local_60;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,
                     msg);
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_88.m_message.px = (element_type *)0x0;
          local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_e0 = 0;
          local_e8 = &PTR__lazy_ostream_0113b090;
          local_d8 = boost::unit_test::lazy_ostream::inst;
          local_d0 = "Bad test: unknown verification flag \'";
          local_c0 = 0;
          local_c8 = &PTR__lazy_ostream_0113e8b0;
          local_b8 = &local_e8;
          local_a8.m_empty = false;
          local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113ecf0;
          local_98 = &local_c8;
          local_90 = "\'";
          local_f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_f0 = "";
          in_R8 = &DAT_00000001;
          in_R9 = &DAT_00000001;
          local_b0 = __x;
          boost::test_tools::tt_detail::report_assertion
                    (&local_88,&local_a8,1,1,WARN,_cVar6,(size_t)&local_f8,0x54);
          boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&mapFlagNames_abi_cxx11_,__x);
        uVar5 = uVar5 | *pmVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&words);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int ParseScriptFlags(std::string strFlags)
{
    unsigned int flags = SCRIPT_VERIFY_NONE;
    if (strFlags.empty() || strFlags == "NONE") return flags;

    std::vector<std::string> words = SplitString(strFlags, ',');
    for (const std::string& word : words)
    {
        if (!mapFlagNames.count(word))
            BOOST_ERROR("Bad test: unknown verification flag '" << word << "'");
        flags |= mapFlagNames[word];
    }
    return flags;
}